

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall
notch::core::FullyConnectedLayer::FullyConnectedLayer
          (FullyConnectedLayer *this,Array *weights,Array *bias,Activation *af)

{
  ulong uVar1;
  valarray<float> *pvVar2;
  float *pfVar3;
  ulong uVar4;
  size_t sVar5;
  
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = (_func_int **)&PTR_tag_abi_cxx11__0011e7a8;
  uVar4 = weights->_M_size;
  uVar1 = bias->_M_size;
  this->nInputs = uVar4 / uVar1;
  this->nOutputs = uVar1;
  pvVar2 = (valarray<float> *)operator_new(0x10);
  pvVar2->_M_size = uVar4;
  pfVar3 = (float *)operator_new(uVar4 << 2);
  pvVar2->_M_data = pfVar3;
  if (weights->_M_data != (float *)0x0) {
    memcpy(pfVar3,weights->_M_data,pvVar2->_M_size << 2);
  }
  (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pvVar2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pvVar2);
  pvVar2 = (valarray<float> *)operator_new(0x10);
  sVar5 = bias->_M_size;
  pvVar2->_M_size = sVar5;
  pfVar3 = (float *)operator_new(sVar5 << 2);
  pvVar2->_M_data = pfVar3;
  if (bias->_M_data != (float *)0x0) {
    memcpy(pfVar3,bias->_M_data,pvVar2->_M_size << 2);
  }
  (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pvVar2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pvVar2);
  this->activationFunction = af;
  sVar5 = this->nOutputs;
  (this->inducedLocalField)._M_size = sVar5;
  uVar4 = sVar5 << 2;
  pfVar3 = (float *)operator_new(uVar4);
  (this->inducedLocalField)._M_data = pfVar3;
  memset(pfVar3,0,uVar4);
  sVar5 = this->nOutputs;
  (this->activationGrad)._M_size = sVar5;
  uVar4 = sVar5 << 2;
  pfVar3 = (float *)operator_new(uVar4);
  (this->activationGrad)._M_data = pfVar3;
  memset(pfVar3,0,uVar4);
  sVar5 = this->nOutputs;
  (this->localGrad)._M_size = sVar5;
  uVar4 = sVar5 << 2;
  pfVar3 = (float *)operator_new(uVar4);
  (this->localGrad)._M_data = pfVar3;
  memset(pfVar3,0,uVar4);
  pvVar2 = (valarray<float> *)operator_new(0x10);
  sVar5 = this->nOutputs * this->nInputs;
  pvVar2->_M_size = sVar5;
  uVar4 = sVar5 * 4;
  pfVar3 = (float *)operator_new(uVar4);
  pvVar2->_M_data = pfVar3;
  memset(pfVar3,0,uVar4);
  (this->weightSensitivity).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pvVar2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->weightSensitivity).
              super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pvVar2);
  pvVar2 = (valarray<float> *)operator_new(0x10);
  sVar5 = this->nOutputs;
  pvVar2->_M_size = sVar5;
  uVar4 = sVar5 << 2;
  pfVar3 = (float *)operator_new(uVar4);
  pvVar2->_M_data = pfVar3;
  memset(pfVar3,0,uVar4);
  (this->biasSensitivity).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pvVar2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->biasSensitivity).
              super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pvVar2);
  sVar5 = this->nInputs;
  (this->propagatedErrors)._M_size = sVar5;
  uVar4 = sVar5 << 2;
  pfVar3 = (float *)operator_new(uVar4);
  (this->propagatedErrors)._M_data = pfVar3;
  memset(pfVar3,0,uVar4);
  (this->policy).super___shared_ptr<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->policy).super___shared_ptr<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

FullyConnectedLayer(const Array &weights, const Array &bias,
                        const Activation &af)
        : nInputs(weights.size()/bias.size()), nOutputs(bias.size()),
          weights(new Array(weights)), bias(new Array(bias)),
          activationFunction(&af), inducedLocalField(nOutputs),
          activationGrad(nOutputs), localGrad(nOutputs),
          weightSensitivity(new Array(nInputs * nOutputs)),
          biasSensitivity(new Array(nOutputs)),
          propagatedErrors(nInputs) {}